

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

matrix2d * tinyusdz::transpose(matrix2d *_m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  matrix2d *in_RDI;
  
  dVar1 = _m->m[0][0];
  dVar2 = _m->m[0][1];
  dVar3 = _m->m[1][0];
  dVar4 = _m->m[1][1];
  in_RDI->m[0][1] = 0.0;
  in_RDI->m[1][0] = 0.0;
  in_RDI->m[0][0] = dVar1;
  in_RDI->m[0][1] = dVar3;
  in_RDI->m[1][0] = dVar2;
  in_RDI->m[1][1] = dVar4;
  return in_RDI;
}

Assistant:

value::matrix2d transpose(const value::matrix2d &_m) {
  matrix22d m;
  matrix22d tm;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 2 * 2);
  tm = linalg::transpose(m);

  value::matrix2d dst;

  // memory layout is same
  memcpy(&dst.m[0][0], &tm[0][0], sizeof(double) * 2 * 2);

  return dst;
}